

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.hpp
# Opt level: O1

uint32_t __thiscall diligent_spirv_cross::CFG::get_visit_order(CFG *this,uint32_t block)

{
  uint32_t uVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar2 = (this->visit_order)._M_h._M_bucket_count;
  uVar4 = (ulong)block % uVar2;
  p_Var5 = (this->visit_order)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(uint32_t *)&p_Var5->_M_nxt[1]._M_nxt != block)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar4) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var3[1]._M_nxt == block)) goto LAB_007caff7;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_007caff7:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    __assert_fail("itr != std::end(visit_order)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cfg.hpp"
                  ,0x46,"uint32_t diligent_spirv_cross::CFG::get_visit_order(uint32_t) const");
  }
  uVar1 = *(uint32_t *)((long)&p_Var3[1]._M_nxt + 4);
  if ((int)uVar1 < 1) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cfg.hpp"
                  ,0x48,"uint32_t diligent_spirv_cross::CFG::get_visit_order(uint32_t) const");
  }
  return uVar1;
}

Assistant:

uint32_t get_visit_order(uint32_t block) const
	{
		auto itr = visit_order.find(block);
		assert(itr != std::end(visit_order));
		int v = itr->second.get();
		assert(v > 0);
		return uint32_t(v);
	}